

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Target.cpp
# Opt level: O0

ReadBuffer __thiscall SCSI::Target::CommandState::read_buffer_specs(CommandState *this)

{
  byte bVar1;
  byte bVar2;
  ReadBuffer RVar3;
  byte *pbVar4;
  const_reference pvVar5;
  CommandState *this_local;
  ReadBuffer specs;
  
  ReadBuffer::ReadBuffer((ReadBuffer *)&this_local);
  pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->data_,1);
  this_local._0_4_ = *pbVar4 & 7;
  if (4 < (uint)this_local) {
    this_local._0_4_ = 4;
  }
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->data_,2);
  this_local._4_4_ = CONCAT31(this_local._5_3_,*pvVar5);
  pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->data_,3);
  bVar1 = *pbVar4;
  pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->data_,4);
  bVar2 = *pbVar4;
  pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->data_,5);
  specs.mode = (uint)bVar1 << 0x10 | (uint)bVar2 << 8 | (uint)*pbVar4;
  pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->data_,6);
  bVar1 = *pbVar4;
  pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->data_,7);
  bVar2 = *pbVar4;
  pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->data_,8);
  RVar3._4_4_ = this_local._4_4_;
  RVar3.mode = (uint)this_local;
  RVar3.buffer_offset = specs.mode;
  RVar3.buffer_length = (uint)bVar1 << 0x10 | (uint)bVar2 << 8 | (uint)*pbVar4;
  return RVar3;
}

Assistant:

CommandState::ReadBuffer CommandState::read_buffer_specs() const {
	ReadBuffer specs;

	specs.mode = ReadBuffer::Mode(data_[1]&7);
	if(specs.mode > ReadBuffer::Mode::Reserved) specs.mode = ReadBuffer::Mode::Reserved;
	specs.buffer_id = data_[2];
	specs.buffer_offset = uint32_t((data_[3] << 16) | (data_[4] << 8) | data_[5]);
	specs.buffer_length = uint32_t((data_[6] << 16) | (data_[7] << 8) | data_[8]);

	return specs;
}